

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

void __thiscall
ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
set<wasm::SmallVector<wasm::Expression*,1ul>>
          (ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *this,
          SmallVector<wasm::Expression_*,_1UL> *list)

{
  long lVar1;
  size_t sVar2;
  array<wasm::Expression_*,_1UL> *paVar3;
  SmallVector<wasm::Expression_*,_1UL> *__range2;
  ulong size;
  ConstIterator CVar4;
  
  size = ((long)(list->flexible).
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(list->flexible).
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_start >> 3) + list->usedFixed;
  if (*(ulong *)(this + 0x10) < size) {
    ArenaVector<wasm::Expression_*>::allocate((ArenaVector<wasm::Expression_*> *)this,size);
  }
  CVar4 = ::wasm::SmallVector<wasm::Expression_*,_1UL>::end(list);
  lVar1 = -8;
  for (sVar2 = 0;
      CVar4.
      super_IteratorBase<const_wasm::SmallVector<wasm::Expression_*,_1UL>,_wasm::SmallVector<wasm::Expression_*,_1UL>::ConstIterator>
      .index != sVar2 ||
      CVar4.
      super_IteratorBase<const_wasm::SmallVector<wasm::Expression_*,_1UL>,_wasm::SmallVector<wasm::Expression_*,_1UL>::ConstIterator>
      .parent != list; sVar2 = sVar2 + 1) {
    paVar3 = (array<wasm::Expression_*,_1UL> *)
             ((long)(list->flexible).
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_start + lVar1);
    if (sVar2 == 0) {
      paVar3 = &list->fixed;
    }
    *(Expression **)(*(long *)this + sVar2 * 8) = paVar3->_M_elems[0];
    lVar1 = lVar1 + 8;
  }
  *(ulong *)(this + 8) = size;
  return;
}

Assistant:

void set(const ListType& list) {
    size_t size = list.size();
    if (allocatedElements < size) {
      static_cast<SubType*>(this)->allocate(size);
    }
    size_t i = 0;
    for (auto elem : list) {
      data[i++] = elem;
    }
    usedElements = size;
  }